

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::Message,google::protobuf::internal::InternalMetadataWithArena>
          (ExtensionSet *this,char *ptr,Message *containing_type,InternalMetadataWithArena *metadata
          ,ParseContext *ctx)

{
  char *ptr_00;
  void *pvVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  MessageLite *pMVar7;
  undefined4 extraout_var;
  UnknownFieldSet *pUVar8;
  uint uVar9;
  ParseContext *unknown;
  char *pcVar10;
  StringPiece val;
  char *ptr_local;
  bool was_packed_on_wire;
  uint32 tag;
  Message *local_f8;
  char *p;
  uint64 tmp;
  string payload;
  ExtensionInfo extension;
  ParseContext tmp_ctx;
  
  payload._M_dataplus._M_p = (pointer)&payload.field_2;
  payload._M_string_length = 0;
  payload.field_2._M_local_buf[0] = '\0';
  ptr_local = ptr;
  local_f8 = containing_type;
LAB_002cbe74:
  uVar9 = 0;
LAB_002cbe76:
  bVar4 = ParseContext::Done(ctx,&ptr_local);
  pcVar10 = ptr_local;
  if (bVar4) goto LAB_002cc07d;
  ptr_00 = ptr_local + 1;
  tag = (uint32)(byte)*ptr_local;
  if (tag == 0x1a) {
    if (uVar9 == 0) {
      ptr_local = ptr_00;
      uVar5 = ReadSize(&ptr_local);
      if (ptr_local == (char *)0x0) goto LAB_002cc06c;
      ptr_local = EpsCopyInputStream::ReadString
                            (&ctx->super_EpsCopyInputStream,ptr_local,uVar5,&payload);
    }
    else {
      ptr_local = ptr_00;
      ptr_local = ParseField(this,(ulong)uVar9 * 8 + 2,ptr_00,local_f8,metadata,ctx);
    }
    uVar9 = 0;
LAB_002cbfc8:
    if (ptr_local != (char *)0x0) goto LAB_002cbe76;
  }
  else {
    if (*ptr_local != 0x10) {
      ptr_local = ptr_00;
      ptr_local = ReadTag(pcVar10,&tag,0);
      if (((ulong)tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        pcVar10 = ptr_local;
        goto LAB_002cc07d;
      }
      ptr_local = ParseField(this,(ulong)tag,ptr_local,local_f8,metadata,ctx);
      goto LAB_002cbfc8;
    }
    ptr_local = ptr_00;
    ptr_local = ParseBigVarint(ptr_00,&tmp);
    uVar5 = (uint32)tmp;
    if (ptr_local == (char *)0x0) goto LAB_002cc06c;
    uVar9 = (uint32)tmp;
    if (payload._M_string_length == 0) goto LAB_002cbe76;
    unknown = ctx;
    bVar4 = FindExtension(this,2,(uint32)tmp,local_f8,ctx,&extension,&was_packed_on_wire);
    sVar3 = payload._M_string_length;
    _Var2 = payload._M_dataplus;
    if (!bVar4) goto LAB_002cc037;
    if (extension.is_repeated == true) {
      pMVar7 = AddMessage(this,uVar5,'\v',(MessageLite *)extension.field_3.enum_validity_check.func,
                          extension.descriptor);
    }
    else {
      pMVar7 = MutableMessage(this,uVar5,'\v',
                              (MessageLite *)extension.field_3.enum_validity_check.func,
                              extension.descriptor);
    }
    ParseContext::ParseContext<std::__cxx11::string&>(&tmp_ctx,ctx->depth_,false,&p,&payload);
    tmp_ctx.data_.pool._0_4_ = *(undefined4 *)&(ctx->data_).pool;
    tmp_ctx.data_.pool._4_4_ = *(undefined4 *)((long)&(ctx->data_).pool + 4);
    tmp_ctx.data_.factory._0_4_ = *(undefined4 *)&(ctx->data_).factory;
    tmp_ctx.data_.factory._4_4_ = *(undefined4 *)((long)&(ctx->data_).factory + 4);
    iVar6 = (*pMVar7->_vptr_MessageLite[0xd])(pMVar7,p,&tmp_ctx);
    if ((CONCAT44(extraout_var,iVar6) != 0) &&
       (uVar9 = 0, tmp_ctx.super_EpsCopyInputStream.last_tag_minus_1_ == 0)) goto LAB_002cbe76;
  }
LAB_002cc06c:
  pcVar10 = (char *)0x0;
LAB_002cc07d:
  std::__cxx11::string::~string((string *)&payload);
  return pcVar10;
LAB_002cc037:
  pvVar1 = (metadata->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    pUVar8 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&metadata->
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar8 = (UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  val.length_ = (stringpiece_ssize_type)pUVar8;
  val.ptr_ = (char *)sVar3;
  WriteLengthDelimited((internal *)(ulong)uVar5,(uint32)_Var2._M_p,val,(UnknownFieldSet *)unknown);
  goto LAB_002cbe74;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(const char* ptr,
                                                  const Msg* containing_type,
                                                  Metadata* metadata,
                                                  internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}